

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O3

Rational AS_02::ConvertToRational(double in)

{
  int iVar1;
  Rational RVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double x;
  double dVar8;
  double dVar9;
  
  iVar6 = 1;
  iVar3 = 0;
  iVar1 = 1;
  iVar4 = 0;
  do {
    iVar7 = (int)(long)in;
    iVar5 = iVar4 * iVar7 + iVar6;
    RVar2.Numerator = iVar1 * iVar7 + iVar3;
    dVar8 = (double)iVar7;
    if ((in == dVar8) && (!NAN(in) && !NAN(dVar8))) break;
    dVar9 = 1.0 / (in - dVar8);
    in = (double)(~-(ulong)(dVar8 != in) & (ulong)in | -(ulong)(dVar8 != in) & (ulong)dVar9);
    iVar6 = iVar4;
    iVar3 = iVar1;
    iVar1 = RVar2.Numerator;
    iVar4 = iVar5;
  } while (dVar9 <= 2147483647.0);
  RVar2.Denominator = iVar5;
  return RVar2;
}

Assistant:

ASDCP::Rational AS_02::ConvertToRational(double in)
{

  //rational approximation to given real number
  //David Eppstein / UC Irvine / 8 Aug 1993
  i32_t m[2][2];
  double x, startx;
  i32_t maxden = std::numeric_limits<i32_t>::max();
  i32_t ai;

  startx = x = in;

  /* initialize matrix */
  m[0][0] = m[1][1] = 1;
  m[0][1] = m[1][0] = 0;

  /* loop finding terms until denom gets too big */
  while(m[1][0] * (ai = (long)x) + m[1][1] <= maxden)
  {
    i32_t t;
    t = m[0][0] * ai + m[0][1];
    m[0][1] = m[0][0];
    m[0][0] = t;
    t = m[1][0] * ai + m[1][1];
    m[1][1] = m[1][0];
    m[1][0] = t;
    if(x == (double)ai) break;     // AF: division by zero
    x = 1 / (x - (double)ai);
    if(x > (double)0x7FFFFFFF) break;  // AF: representation failure
  }

  /* now remaining x is between 0 and 1/ai */
  /* approx as either 0 or 1/m where m is max that will fit in maxden */
  /* first try zero */
  //printf("%ld/%ld, error = %e\n", m[0][0], m[1][0], startx - ((double)m[0][0] / (double)m[1][0]));

  return(ASDCP::Rational(m[0][0], m[1][0]));
  /* now try other possibility */
  //   ai = (maxden - m[1][1]) / m[1][0];
  //   m[0][0] = m[0][0] * ai + m[0][1];
  //   m[1][0] = m[1][0] * ai + m[1][1];
  //   printf("%ld/%ld, error = %e\n", m[0][0], m[1][0], startx - ((double)m[0][0] / (double)m[1][0]));
}